

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QNetworkCookie>::clear(QList<QNetworkCookie> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QNetworkCookie> *this_00;
  __off_t __length;
  QArrayDataPointer<QNetworkCookie> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QNetworkCookie> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  qsizetype alloc;
  QArrayDataPointer<QNetworkCookie> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QNetworkCookie> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QNetworkCookie>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QNetworkCookie>::needsDetach(in_RDI);
    if (bVar2) {
      qVar3 = -0x5555555555555556;
      alloc = -0x5555555555555556;
      pQVar4 = (QArrayDataPointer<QNetworkCookie> *)0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<QNetworkCookie>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QNetworkCookie>::QArrayDataPointer(pQVar4,alloc,qVar3,option);
      QArrayDataPointer<QNetworkCookie>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QNetworkCookie>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QNetworkCookie> *)
                QArrayDataPointer<QNetworkCookie>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QNetworkCookie>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }